

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O1

void __thiscall xemmai::t_io::f_scan(t_io *this,t_scan a_scan)

{
  (*a_scan)((this->v_symbol_close).v_p._M_b._M_p);
  (*a_scan)((this->v_symbol_read).v_p._M_b._M_p);
  (*a_scan)((this->v_symbol_write).v_p._M_b._M_p);
  (*a_scan)((this->v_symbol_flush).v_p._M_b._M_p);
  (*a_scan)((this->v_symbol_read_line).v_p._M_b._M_p);
  (*a_scan)((this->v_symbol_write_line).v_p._M_b._M_p);
  (*a_scan)((this->v_symbol_resume).v_p._M_b._M_p);
  (*a_scan)((this->v_type_file).v_slot.v_p._M_b._M_p);
  (*a_scan)((this->v_type_reader).v_slot.v_p._M_b._M_p);
  (*a_scan)((this->v_type_writer).v_slot.v_p._M_b._M_p);
  return;
}

Assistant:

void t_io::f_scan(t_scan a_scan)
{
	a_scan(v_symbol_close);
	a_scan(v_symbol_read);
	a_scan(v_symbol_write);
	a_scan(v_symbol_flush);
	a_scan(v_symbol_read_line);
	a_scan(v_symbol_write_line);
	a_scan(v_symbol_resume);
	a_scan(v_type_file);
	a_scan(v_type_reader);
	a_scan(v_type_writer);
}